

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int __thiscall ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  Mat *dst;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  uint uVar11;
  void *pvVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  void *pvVar21;
  ulong uVar22;
  int iVar24;
  undefined1 auVar23 [16];
  undefined4 uVar25;
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  Mat top_blob_bordered;
  int remain;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_119;
  undefined1 local_118 [24];
  int iStack_100;
  int iStack_fc;
  undefined1 local_f8 [16];
  ulong local_e8;
  ulong local_e0;
  void *local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  long local_c0;
  Deconvolution *local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  Mat *local_98;
  void *local_90;
  void *local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  long local_68;
  Mat *local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar11 = bottom_blob->w;
  local_a0 = (ulong)uVar11;
  uVar19 = bottom_blob->h;
  local_a8 = (ulong)uVar19;
  iVar24 = this->kernel_w;
  iVar28 = this->dilation_w;
  iVar2 = this->kernel_h;
  iVar13 = this->dilation_h;
  uVar3 = bottom_blob->c;
  iVar20 = this->stride_w;
  iVar15 = this->stride_h;
  local_118._0_8_ = top_blob->data;
  local_118._8_8_ = top_blob->refcount;
  local_118._16_8_ = top_blob->elemsize;
  iStack_100 = top_blob->dims;
  if ((int *)local_118._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_118._8_8_ = *(int *)local_118._8_8_ + 1;
    UNLOCK();
  }
  iVar20 = (iVar24 + -1) * iVar28 + (uVar11 - 1) * iVar20 + 1;
  iVar24 = (iVar2 + -1) * iVar13 + 1 + (uVar19 - 1) * iVar15;
  iStack_fc = top_blob->w;
  local_f8._0_4_ = top_blob->h;
  local_f8._4_4_ = top_blob->c;
  local_f8._8_8_ = top_blob->cstep;
  iVar28 = this->num_output;
  local_60 = bottom_blob;
  if ((((iStack_100 != 3) || (top_blob->w != iVar20)) || (top_blob->h != iVar24)) ||
     ((top_blob->c != iVar28 || (local_118._16_8_ != 4)))) {
    if ((int *)local_118._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_118._8_8_ = *(int *)local_118._8_8_ + -1;
      UNLOCK();
      if ((*(int *)local_118._8_8_ == 0) && ((void *)local_118._0_8_ != (void *)0x0)) {
        local_d8 = (void *)CONCAT44(local_d8._4_4_,iVar20);
        free(*(void **)(local_118._0_8_ - 8));
        iVar20 = (int)local_d8;
      }
    }
    local_118._0_8_ = (void *)0x0;
    local_118._8_8_ = (int *)0x0;
    iStack_100 = 3;
    local_118._16_8_ = 4;
    iStack_fc = iVar20;
    local_f8._4_4_ = iVar28;
    local_f8._0_4_ = iVar24;
    local_f8._8_8_ = (long)(iVar24 * iVar20) + 3U & 0x3ffffffffffffffc;
    lVar16 = local_f8._8_8_ * (long)iVar28;
    if (lVar16 != 0) {
      pvVar12 = malloc(lVar16 * 4 + 0x1c);
      local_118._0_8_ = (long)pvVar12 + 0x17U & 0xfffffffffffffff0;
      *(void **)(local_118._0_8_ - 8) = pvVar12;
      local_118._8_8_ = local_118._0_8_ + lVar16 * 4;
      *(int *)local_118._8_8_ = 1;
    }
  }
  iVar24 = -100;
  local_98 = top_blob;
  if ((void *)local_118._0_8_ == (void *)0x0) goto LAB_0010d99c;
  if ((long)(int)local_f8._4_4_ * local_f8._8_8_ == 0) goto LAB_0010d99c;
  uVar11 = this->kernel_w * this->kernel_h;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)(int)uVar11,&local_119);
  dst = local_98;
  if (0 < this->kernel_h) {
    iVar24 = this->dilation_h;
    iVar28 = this->dilation_w;
    iVar2 = this->kernel_w;
    iVar13 = 0;
    iVar15 = 0;
    iVar18 = 0;
    do {
      if (0 < this->kernel_w) {
        lVar16 = 0;
        do {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar18 + lVar16] = iVar15;
          iVar15 = iVar15 + this->dilation_w;
          lVar16 = lVar16 + 1;
        } while ((int)lVar16 < this->kernel_w);
        iVar18 = iVar18 + (int)lVar16;
      }
      iVar15 = iVar15 + (iVar20 * iVar24 - iVar28 * iVar2);
      iVar13 = iVar13 + 1;
    } while (iVar13 < this->kernel_h);
  }
  auVar9 = _DAT_001334a0;
  auVar8 = _DAT_00133490;
  auVar7 = _DAT_00133420;
  local_70 = (long)this->num_output;
  if (0 < local_70) {
    local_c0 = local_f8._8_8_ * local_118._16_8_;
    local_d0 = iStack_fc;
    uVar19 = local_f8._0_4_ * iStack_fc;
    local_78 = (ulong)uVar19;
    local_c8 = this->bias_term;
    local_90 = (this->bias_data).data;
    local_80 = (ulong)(uVar19 + 3 & 0xfffffffc);
    lVar16 = local_78 - 1;
    auVar23._8_4_ = (int)lVar16;
    auVar23._0_8_ = lVar16;
    auVar23._12_4_ = (int)((ulong)lVar16 >> 0x20);
    local_88 = (void *)local_118._0_8_;
    local_cc = uVar3 * uVar11;
    local_e8 = 0;
    auVar23 = auVar23 ^ _DAT_00133420;
    lVar16 = 0;
    lVar10 = local_118._0_8_ + 0xc;
    do {
      local_68 = lVar10;
      local_b0 = lVar16;
      if (local_c8 == 0) {
        uVar25 = 0;
      }
      else {
        uVar25 = *(undefined4 *)((long)local_90 + local_b0 * 4);
      }
      if (0 < (int)uVar19) {
        uVar14 = 0;
        do {
          auVar26._8_4_ = (int)uVar14;
          auVar26._0_8_ = uVar14;
          auVar26._12_4_ = (int)(uVar14 >> 0x20);
          auVar27 = (auVar26 | auVar9) ^ auVar7;
          iVar24 = auVar23._4_4_;
          if ((bool)(~(iVar24 < auVar27._4_4_ ||
                      auVar23._0_4_ < auVar27._0_4_ && auVar27._4_4_ == iVar24) & 1)) {
            *(undefined4 *)(local_68 + -0xc + uVar14 * 4) = uVar25;
          }
          if (auVar27._12_4_ <= auVar23._12_4_ &&
              (auVar27._8_4_ <= auVar23._8_4_ || auVar27._12_4_ != auVar23._12_4_)) {
            *(undefined4 *)(local_68 + -8 + uVar14 * 4) = uVar25;
          }
          auVar26 = (auVar26 | auVar8) ^ auVar7;
          iVar28 = auVar26._4_4_;
          if (iVar28 <= iVar24 && (iVar28 != iVar24 || auVar26._0_4_ <= auVar23._0_4_)) {
            *(undefined4 *)(local_68 + -4 + uVar14 * 4) = uVar25;
            *(undefined4 *)(local_68 + uVar14 * 4) = uVar25;
          }
          uVar14 = uVar14 + 4;
        } while (local_80 != uVar14);
      }
      if (0 < (int)local_a8) {
        local_58 = (void *)(local_c0 * local_b0 + local_118._0_8_);
        local_c4 = this->stride_h * iStack_fc;
        local_50 = (long)this->stride_w;
        local_d8 = (void *)((long)(int)local_e8 * 4 + (long)(this->weight_data).data);
        local_e0 = 0;
        do {
          if (0 < (int)local_a0) {
            iVar24 = local_60->w;
            sVar4 = local_60->cstep;
            sVar5 = local_60->elemsize;
            pvVar12 = local_60->data;
            uVar14 = 0;
            do {
              if (0 < (int)uVar3) {
                lVar16 = uVar14 * local_50 * 4 + (long)(local_c4 * (int)local_e0) * 4;
                uVar17 = 0;
                pvVar21 = local_d8;
                do {
                  if (0 < (int)uVar11) {
                    fVar1 = *(float *)((long)pvVar12 +
                                      sVar4 * sVar5 * uVar17 +
                                      uVar14 * 4 + (long)iVar24 * local_e0 * 4);
                    uVar22 = 0;
                    do {
                      *(float *)((long)local_58 +
                                (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[uVar22] * 4 + lVar16) =
                           *(float *)((long)pvVar21 + uVar22 * 4) * fVar1 +
                           *(float *)((long)local_58 +
                                     (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar22] * 4 +
                                     lVar16);
                      uVar22 = uVar22 + 1;
                    } while (uVar11 != uVar22);
                  }
                  uVar17 = uVar17 + 1;
                  pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar11 * 4);
                } while (uVar17 != uVar3);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != local_a0);
          }
          local_e0 = local_e0 + 1;
        } while (local_e0 != local_a8);
      }
      local_e8 = (ulong)(uint)((int)local_e8 + local_cc);
      lVar16 = local_b0 + 1;
      lVar10 = local_68 + local_c0;
      local_b8 = this;
    } while (local_b0 + 1 != local_70);
  }
  if ((Mat *)local_118 != local_98) {
    if ((int *)local_118._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_118._8_8_ = *(int *)local_118._8_8_ + 1;
      UNLOCK();
    }
    piVar6 = local_98->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if ((*piVar6 == 0) && (local_98->data != (void *)0x0)) {
        free(*(void **)((long)local_98->data + -8));
      }
    }
    auVar8 = local_f8;
    auVar7 = stack0xfffffffffffffef8;
    dst->h = 0;
    dst->c = 0;
    dst->cstep = 0;
    dst->elemsize = 0;
    dst->dims = 0;
    dst->w = 0;
    dst->data = (void *)0x0;
    dst->refcount = (int *)0x0;
    dst->data = (void *)local_118._0_8_;
    dst->refcount = (int *)local_118._8_8_;
    dst->elemsize = local_118._16_8_;
    dst->dims = iStack_100;
    dst->w = iStack_fc;
    dst->h = local_f8._0_4_;
    dst->c = local_f8._4_4_;
    local_f8._8_8_ = auVar8._8_8_;
    dst->cstep = local_f8._8_8_;
    unique0x100007a0 = auVar7;
    local_f8 = auVar8;
  }
  iVar24 = this->pad_w;
  iVar28 = this->pad_h;
  if (iVar28 < 1 && iVar24 < 1) {
LAB_0010d97c:
    iVar24 = 0;
  }
  else {
    copy_cut_border((Mat *)local_118,dst,iVar28,iVar28,iVar24,iVar24);
    iVar24 = -100;
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) goto LAB_0010d97c;
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0010d99c:
  if ((int *)local_118._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_118._8_8_ = *(int *)local_118._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_118._8_8_ == 0) && ((void *)local_118._0_8_ != (void *)0x0)) {
      free(*(void **)(local_118._0_8_ - 8));
    }
  }
  return iVar24;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered = top_blob;
    top_blob_bordered.create(outw, outh, num_output);
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }
    }

    top_blob = top_blob_bordered;

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }

    return 0;
}